

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O3

void QSslContext::applyBackendConfig(QSslContext *sslContext)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  const_iterator cVar6;
  SSL_CONF_CTX *a;
  Data *dd;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  char16_t *pcVar10;
  _Base_ptr b;
  longlong lVar11;
  long in_FS_OFFSET;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QString local_c8;
  undefined1 local_b0 [24];
  QArrayData *local_98;
  char16_t *pcStack_90;
  qsizetype local_88;
  QByteArray local_78;
  QMetaType local_60;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  local_58;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QSslConfiguration::backendConfiguration();
  if ((local_58.d.ptr !=
       (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
        *)0x0) && (*(long *)((long)local_58.d.ptr + 0x30) != 0)) {
    QByteArray::QByteArray(&local_50,anon_var_dwarf_120d27,-1);
    if (local_58.d.ptr ==
        (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
         *)0x0) {
      cVar6._M_node = (_Base_ptr)0x0;
    }
    else {
      cVar6 = std::
              _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QVariant>,_std::_Select1st<std::pair<const_QByteArray,_QVariant>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>
              ::find((_Rb_tree<QByteArray,_std::pair<const_QByteArray,_QVariant>,_std::_Select1st<std::pair<const_QByteArray,_QVariant>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>
                      *)((long)local_58.d.ptr + 8),&local_50);
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    p_Var8 = (_Base_ptr)((long)local_58.d.ptr + 0x10);
    if (local_58.d.ptr ==
        (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
         *)0x0) {
      p_Var8 = (_Base_ptr)0x0;
    }
    if (cVar6._M_node != p_Var8) {
      q_SSL_CTX_callback_ctrl(sslContext->ctx,0x3f,qt_OCSP_status_server_callback);
      if ((local_58.d.ptr !=
           (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
            *)0x0) && (*(long *)((long)local_58.d.ptr + 0x30) == 1)) goto LAB_0012c91f;
    }
    a = q_SSL_CONF_CTX_new();
    dd = (Data *)operator_new(0x20);
    *(code **)(dd + 1) = q_SSL_CONF_CTX_free;
    dd[1].destroyer = (DestroyerFn)a;
    dd->destroyer =
         QtSharedPointer::
         ExternalRefCountWithCustomDeleter<ssl_conf_ctx_st,_void_(*)(ssl_conf_ctx_st_*)>::deleter;
    (dd->strongref)._q_value.super___atomic_base<int>._M_i = 1;
    (dd->weakref)._q_value.super___atomic_base<int>._M_i = 1;
    if (a == (SSL_CONF_CTX *)0x0) {
      QMetaObject::tr((char *)&local_98,(char *)&QSslSocket::staticMetaObject,0x13c4ea);
      QMetaObject::tr((char *)&local_50,(char *)&QSslSocket::staticMetaObject,0x13c573);
      QVar12.m_size = (size_t)&local_50;
      QVar12.field_0.m_data = &local_78;
      QString::arg_impl(QVar12,(int)pcStack_90,(QChar)(char16_t)local_88);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar1 = &((sslContext->errorStr).d.d)->super_QArrayData;
      pcVar10 = (sslContext->errorStr).d.ptr;
      (sslContext->errorStr).d.d = (Data *)local_78.d.d;
      (sslContext->errorStr).d.ptr = (char16_t *)local_78.d.ptr;
      qVar2 = (sslContext->errorStr).d.size;
      (sslContext->errorStr).d.size = local_78.d.size;
      local_78.d.d = (Data *)pQVar1;
      local_78.d.ptr = (char *)pcVar10;
      local_78.d.size = qVar2;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,2,0x10);
        }
      }
      sslContext->errorCode = UnspecifiedError;
    }
    else {
      q_SSL_CONF_CTX_set_ssl_ctx(a,sslContext->ctx);
      q_SSL_CONF_CTX_set_flags(a,2);
      if (local_58.d.ptr ==
          (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
           *)0x0) {
        p_Var7 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var7 = *(_Rb_tree_node_base **)((long)local_58.d.ptr + 0x20);
      }
      p_Var9 = (_Rb_tree_node_base *)((long)local_58.d.ptr + 0x10);
      if (local_58.d.ptr ==
          (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
           *)0x0) {
        p_Var9 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var7 != p_Var9) {
        do {
          local_50.d.d = (Data *)anon_var_dwarf_120d27;
          bVar3 = operator==((QByteArray *)(p_Var7 + 1),(char **)&local_50);
          if (!bVar3) {
            QMetaType::QMetaType(&local_60,0xc);
            cVar4 = QMetaType::canConvert
                              ((QMetaTypeInterface *)((ulong)p_Var7[2]._M_left & 0xfffffffffffffffc)
                               ,local_60);
            if (cVar4 == '\0') {
              sslContext->errorCode = UnspecifiedError;
              QMetaObject::tr(local_b0,(char *)&QSslSocket::staticMetaObject,0x13c453);
              QVar14.m_size = (size_t)local_b0;
              QVar14.field_0.m_data = &local_98;
              QString::arg_impl(QVar14,(int)p_Var7[1]._M_parent,(QChar)(char16_t)p_Var7[1]._M_left);
              QMetaObject::tr((char *)&local_50,(char *)&QSslSocket::staticMetaObject,0x13c573);
              QVar15.m_size = (size_t)&local_50;
              QVar15.field_0.m_data = &local_78;
              QString::arg_impl(QVar15,(int)pcStack_90,(QChar)(char16_t)local_88);
              if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
                }
              }
              pQVar1 = &((sslContext->errorStr).d.d)->super_QArrayData;
              pcVar10 = (sslContext->errorStr).d.ptr;
              (sslContext->errorStr).d.d = (Data *)local_78.d.d;
              (sslContext->errorStr).d.ptr = (char16_t *)local_78.d.ptr;
              qVar2 = (sslContext->errorStr).d.size;
              (sslContext->errorStr).d.size = local_78.d.size;
              local_78.d.d = (Data *)pQVar1;
              local_78.d.ptr = (char *)pcVar10;
              local_78.d.size = qVar2;
              if (pQVar1 != (QArrayData *)0x0) {
                LOCK();
                (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(pQVar1,2,0x10);
                }
              }
              if (local_98 != (QArrayData *)0x0) {
                LOCK();
                (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_98,2,0x10);
                }
              }
              if ((QArrayData *)local_b0._0_8_ == (QArrayData *)0x0) goto LAB_0012c917;
              LOCK();
              (((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i != 0
                 ) goto LAB_0012c917;
              lVar11 = 2;
            }
            else {
              QVariant::toByteArray();
              b = p_Var7[1]._M_parent;
              if (b == (_Base_ptr)0x0) {
                b = (_Base_ptr)&QByteArray::_empty;
              }
              pcVar10 = (char16_t *)local_78.d.ptr;
              if ((char16_t *)local_78.d.ptr == (char16_t *)0x0) {
                pcVar10 = (char16_t *)&QByteArray::_empty;
              }
              iVar5 = q_SSL_CONF_cmd(a,(char *)b,(char *)pcVar10);
              if (iVar5 == 2) {
                if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
                  }
                }
                goto LAB_0012c4da;
              }
              sslContext->errorCode = UnspecifiedError;
              if (iVar5 == 1) {
                iVar5 = 0x13c49c;
              }
              else if (iVar5 == 0) {
                iVar5 = 0x13c46f;
              }
              else {
                iVar5 = 0x13c4b4;
              }
              QMetaObject::tr((char *)&local_c8,(char *)&QSslSocket::staticMetaObject,iVar5);
              QString::arg<QByteArray_const&,QByteArray_const&>
                        ((type *)local_b0,&local_c8,(QByteArray *)(p_Var7 + 1),&local_78);
              QMetaObject::tr((char *)&local_50,(char *)&QSslSocket::staticMetaObject,0x13c573);
              QVar16.m_size = (size_t)&local_50;
              QVar16.field_0.m_data = &local_98;
              QString::arg_impl(QVar16,local_b0._8_4_,(QChar)local_b0._16_2_);
              if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
                }
              }
              pQVar1 = &((sslContext->errorStr).d.d)->super_QArrayData;
              pcVar10 = (sslContext->errorStr).d.ptr;
              (sslContext->errorStr).d.d = (Data *)local_98;
              (sslContext->errorStr).d.ptr = pcStack_90;
              qVar2 = (sslContext->errorStr).d.size;
              (sslContext->errorStr).d.size = local_88;
              local_98 = pQVar1;
              pcStack_90 = pcVar10;
              local_88 = qVar2;
              if (pQVar1 != (QArrayData *)0x0) {
                LOCK();
                (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(pQVar1,2,0x10);
                }
              }
              if ((QArrayData *)local_b0._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_b0._0_8_,2,0x10);
                }
              }
              if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0012c917;
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i !=
                  0) goto LAB_0012c917;
              lVar11 = 1;
              local_b0._0_8_ = local_78.d.d;
            }
            QArrayData::deallocate((QArrayData *)local_b0._0_8_,lVar11,0x10);
            goto LAB_0012c917;
          }
LAB_0012c4da:
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          p_Var9 = (_Rb_tree_node_base *)((long)local_58.d.ptr + 0x10);
          if (local_58.d.ptr ==
              (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
               *)0x0) {
            p_Var9 = (_Rb_tree_node_base *)0x0;
          }
        } while (p_Var7 != p_Var9);
      }
      iVar5 = q_SSL_CONF_CTX_finish(a);
      if (iVar5 == 0) {
        QMetaObject::tr((char *)&local_98,(char *)&QSslSocket::staticMetaObject,0x13c4d1);
        QMetaObject::tr((char *)&local_50,(char *)&QSslSocket::staticMetaObject,0x13c573);
        QVar13.m_size = (size_t)&local_50;
        QVar13.field_0.m_data = &local_78;
        QString::arg_impl(QVar13,(int)pcStack_90,(QChar)(char16_t)local_88);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar1 = &((sslContext->errorStr).d.d)->super_QArrayData;
        pcVar10 = (sslContext->errorStr).d.ptr;
        (sslContext->errorStr).d.d = (Data *)local_78.d.d;
        (sslContext->errorStr).d.ptr = (char16_t *)local_78.d.ptr;
        qVar2 = (sslContext->errorStr).d.size;
        (sslContext->errorStr).d.size = local_78.d.size;
        local_78.d.d = (Data *)pQVar1;
        local_78.d.ptr = (char *)pcVar10;
        local_78.d.size = qVar2;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
        if (local_98 != (QArrayData *)0x0) {
          LOCK();
          (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98,2,0x10);
          }
        }
        sslContext->errorCode = UnspecifiedError;
      }
    }
LAB_0012c917:
    QSharedPointer<ssl_conf_ctx_st>::deref(dd);
  }
LAB_0012c91f:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslContext::applyBackendConfig(QSslContext *sslContext)
{
    const QMap<QByteArray, QVariant> &conf = sslContext->sslConfiguration.backendConfiguration();
    if (conf.isEmpty())
        return;

#if QT_CONFIG(ocsp)
    auto ocspResponsePos = conf.find("Qt-OCSP-response");
    if (ocspResponsePos != conf.end()) {
        // This is our private, undocumented configuration option, existing only for
        // the purpose of testing OCSP status responses. We don't even check this
        // callback was set. If no - the test must fail.
        q_SSL_CTX_set_tlsext_status_cb(sslContext->ctx, QTlsPrivate::qt_OCSP_status_server_callback);
        if (conf.size() == 1)
            return;
    }
#endif // ocsp

    QSharedPointer<SSL_CONF_CTX> cctx(q_SSL_CONF_CTX_new(), &q_SSL_CONF_CTX_free);
    if (cctx) {
        q_SSL_CONF_CTX_set_ssl_ctx(cctx.data(), sslContext->ctx);
        q_SSL_CONF_CTX_set_flags(cctx.data(), SSL_CONF_FLAG_FILE);

        for (auto i = conf.constBegin(); i != conf.constEnd(); ++i) {
            if (i.key() == "Qt-OCSP-response") // This never goes to SSL_CONF_cmd().
                continue;

            if (!i.value().canConvert(QMetaType(QMetaType::QByteArray))) {
                sslContext->errorCode = QSslError::UnspecifiedError;
                sslContext->errorStr = msgErrorSettingBackendConfig(
                QSslSocket::tr("Expecting QByteArray for %1").arg(i.key()));
                return;
            }

            const QByteArray &value = i.value().toByteArray();
            const int result = q_SSL_CONF_cmd(cctx.data(), i.key().constData(), value.constData());
            if (result == 2)
                continue;

            sslContext->errorCode = QSslError::UnspecifiedError;
            switch (result) {
            case 0:
                sslContext->errorStr = msgErrorSettingBackendConfig(
                    QSslSocket::tr("An error occurred attempting to set %1 to %2")
                            .arg(i.key(), value));
                return;
            case 1:
                sslContext->errorStr = msgErrorSettingBackendConfig(
                    QSslSocket::tr("Wrong value for %1 (%2)").arg(i.key(), value));
                return;
            default:
                sslContext->errorStr = msgErrorSettingBackendConfig(
                    QSslSocket::tr("Unrecognized command %1 = %2").arg(i.key(), value));
                return;
            }
        }

        if (q_SSL_CONF_CTX_finish(cctx.data()) == 0) {
            sslContext->errorStr = msgErrorSettingBackendConfig(QSslSocket::tr("SSL_CONF_finish() failed"));
            sslContext->errorCode = QSslError::UnspecifiedError;
        }
    } else {
        sslContext->errorStr = msgErrorSettingBackendConfig(QSslSocket::tr("SSL_CONF_CTX_new() failed"));
        sslContext->errorCode = QSslError::UnspecifiedError;
    }
}